

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2obs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  double dVar2;
  CESkyCoord obs_icrs_coords;
  CESkyCoord obs_coords;
  CEObserver observer;
  CEDate date;
  CESkyCoord icrs_coords;
  CEExecOptions opts;
  CEExecOptions *in_stack_fffffffffffff980;
  CLOptions *in_stack_fffffffffffff988;
  CLOptions *this;
  CESkyCoord local_5d0 [48];
  CESkyCoord local_5a0 [55];
  allocator<char> local_569;
  string local_568 [32];
  CEExecOptions *local_548;
  allocator local_539;
  string local_538 [32];
  double local_518;
  allocator local_509;
  string local_508 [32];
  double local_4e8;
  allocator local_4d9;
  string local_4d8 [32];
  double local_4b8;
  CEAngleType local_4b0;
  allocator local_4a9;
  string local_4a8 [32];
  double local_488;
  allocator local_479;
  string local_478 [32];
  double local_458;
  allocator local_449;
  string local_448 [32];
  double local_428;
  CEObserver local_420 [152];
  char **in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  CLOptions *in_stack_fffffffffffffc88;
  CESkyCoord *in_stack_fffffffffffffc90;
  CESkyCoord *in_stack_fffffffffffffc98;
  CESkyCoord *in_stack_fffffffffffffca0;
  CEDate local_348 [64];
  CESkyCoordType local_308;
  allocator local_301;
  string local_300 [32];
  double local_2e0;
  CEAngle local_2d8 [23];
  allocator local_2c1;
  string local_2c0 [32];
  double local_2a0;
  CEAngle local_298 [16];
  CESkyCoord local_288 [48];
  undefined4 local_258;
  int local_4;
  
  local_4 = 0;
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine
                    (in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,in_stack_fffffffffffffc78);
  if (bVar1) {
    local_4 = 0;
    local_258 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"ra",&local_2c1);
    local_2a0 = CLOptions::AsDouble(in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    CEAngle::Deg((double *)local_298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"dec",&local_301);
    local_2e0 = CLOptions::AsDouble(in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    CEAngle::Deg((double *)local_2d8);
    local_308 = ICRS;
    CESkyCoord::CESkyCoord(local_288,local_298,local_2d8,&local_308);
    CEAngle::~CEAngle(local_2d8);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    CEAngle::~CEAngle(local_298);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffc98,"juliandate",(allocator *)&stack0xfffffffffffffc97
              );
    dVar2 = CLOptions::AsDouble(in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    CEDate::CEDate(local_348,dVar2,JD);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc97);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"longitude",&local_449);
    local_428 = CLOptions::AsDouble(in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"latitude",&local_479);
    local_458 = CLOptions::AsDouble(in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a8,"elevation",&local_4a9);
    local_488 = CLOptions::AsDouble(in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    local_4b0 = DEGREES;
    CEObserver::CEObserver(local_420,&local_428,&local_458,&local_488,&local_4b0);
    std::__cxx11::string::~string(local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d8,"pressure",&local_4d9);
    local_4b8 = CLOptions::AsDouble(in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    CEObserver::SetPressure_hPa(local_420,&local_4b8);
    std::__cxx11::string::~string(local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_508,"temperature",&local_509);
    local_4e8 = CLOptions::AsDouble(in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    CEObserver::SetTemperature_C(local_420,&local_4e8);
    std::__cxx11::string::~string(local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_538,"humidity",&local_539);
    local_518 = CLOptions::AsDouble(in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    CEObserver::SetRelativeHumidity(local_420,&local_518);
    std::__cxx11::string::~string(local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_539);
    this = (CLOptions *)&local_569;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"wavelength",(allocator *)this);
    in_stack_fffffffffffff980 =
         (CEExecOptions *)CLOptions::AsDouble(this,(string *)in_stack_fffffffffffff980);
    local_548 = in_stack_fffffffffffff980;
    CEObserver::SetWavelength_um(local_420,(double *)&local_548);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator(&local_569);
    CESkyCoord::CESkyCoord(local_5a0);
    CESkyCoord::CESkyCoord(local_5d0);
    CESkyCoord::ICRS2Observed(local_288,local_5a0,local_348,local_420,local_5d0,(CEAngle *)0x0);
    PrintResults(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                 (CEObserver *)in_stack_fffffffffffffc88,
                 (CEDate *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
    local_4 = 0;
    local_258 = 1;
    CESkyCoord::~CESkyCoord(local_5d0);
    CESkyCoord::~CESkyCoord(local_5a0);
    CEObserver::~CEObserver(local_420);
    CEDate::~CEDate(local_348);
    CESkyCoord::~CESkyCoord(local_288);
  }
  CEExecOptions::~CEExecOptions(in_stack_fffffffffffff980);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{    
    CEExecOptions opts = DefineOpts();
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Create the input and output coordinates
    CESkyCoord icrs_coords(CEAngle::Deg(opts.AsDouble("ra")), 
                           CEAngle::Deg(opts.AsDouble("dec")),
                           CESkyCoordType::ICRS);
    
    // Define the date
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);

    // Define the observer
    CEObserver observer(opts.AsDouble("longitude"),
                        opts.AsDouble("latitude"),
                        opts.AsDouble("elevation"),
                        CEAngleType::DEGREES);
    observer.SetPressure_hPa(opts.AsDouble("pressure"));
    observer.SetTemperature_C(opts.AsDouble("temperature"));
    observer.SetRelativeHumidity(opts.AsDouble("humidity"));
    observer.SetWavelength_um(opts.AsDouble("wavelength"));

    // Convert the coordinates
    CESkyCoord obs_coords;
    CESkyCoord obs_icrs_coords;
    CESkyCoord::ICRS2Observed(icrs_coords, &obs_coords, date, observer, &obs_icrs_coords);
    
    // Print the results
    PrintResults(icrs_coords, obs_coords, obs_icrs_coords, observer, date);
    
    return 0 ;
}